

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void printfFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db_00;
  uchar *zFormat_00;
  char *z;
  sqlite3 *db;
  int n;
  char *zFormat;
  StrAccum str;
  PrintfArguments x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  if (0 < argc) {
    zFormat_00 = sqlite3_value_text(*argv);
    if (zFormat_00 != (uchar *)0x0) {
      str.nChar = argc - 1;
      str.accError = '\0';
      str.printfFlags = '\0';
      str._30_2_ = 0;
      sqlite3StrAccumInit((StrAccum *)&zFormat,db_00,(char *)0x0,0,db_00->aLimit[0]);
      str.mxAlloc._1_1_ = 2;
      sqlite3_str_appendf((StrAccum *)&zFormat,(char *)zFormat_00,&str.nChar);
      z = sqlite3StrAccumFinish((StrAccum *)&zFormat);
      sqlite3_result_text(context,z,str.nAlloc,sqlite3MallocSize);
    }
  }
  return;
}

Assistant:

static void printfFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  PrintfArguments x;
  StrAccum str;
  const char *zFormat;
  int n;
  sqlite3 *db = sqlite3_context_db_handle(context);

  if( argc>=1 && (zFormat = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    x.nArg = argc-1;
    x.nUsed = 0;
    x.apArg = argv+1;
    sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
    str.printfFlags = SQLITE_PRINTF_SQLFUNC;
    sqlite3_str_appendf(&str, zFormat, &x);
    n = str.nChar;
    sqlite3_result_text(context, sqlite3StrAccumFinish(&str), n,
                        SQLITE_DYNAMIC);
  }
}